

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkTransferNames(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  
  if ((0 < (pNew->vCopies).nSize) || ((p->vCopies).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasCopy(pNew) && Wlc_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x341,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if ((0 < (pNew->vNameIds).nSize) || ((p->vNameIds).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x342,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x343,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  uVar1 = pNew->nObjsAlloc;
  if ((pNew->vNameIds).nCap < (int)uVar1) {
    piVar4 = (pNew->vNameIds).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (pNew->vNameIds).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNew->vNameIds).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNew->vNameIds).pArray,0,(ulong)uVar1 * 4);
  }
  (pNew->vNameIds).nSize = uVar1;
  if (0 < p->nObjsAlloc) {
    lVar5 = 0;
    do {
      if ((p->vCopies).nSize <= lVar5) {
LAB_0036d481:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vCopies).pArray[lVar5];
      if ((0 < (long)iVar2) && (lVar5 < (p->vNameIds).nSize)) {
        if ((p->vNameIds).nSize <= lVar5) goto LAB_0036d481;
        iVar3 = (p->vNameIds).pArray[lVar5];
        if (iVar3 != 0) {
          if ((pNew->vNameIds).nSize <= iVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNew->vNameIds).pArray[iVar2] = iVar3;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nObjsAlloc);
  }
  pNew->pManName = p->pManName;
  p->pManName = (Abc_Nam_t *)0x0;
  piVar4 = (p->vNameIds).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vNameIds).pArray = (int *)0x0;
  }
  (p->vNameIds).nCap = 0;
  (p->vNameIds).nSize = 0;
  pNew->pMemTable = p->pMemTable;
  p->pMemTable = (Mem_Flex_t *)0x0;
  pNew->vTables = p->vTables;
  p->vTables = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Wlc_NtkTransferNames( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p )
{
    int i;
    assert( !Wlc_NtkHasCopy(pNew)   && Wlc_NtkHasCopy(p)   );
    assert( !Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p) );
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    Wlc_NtkCleanNameId( pNew );
    for ( i = 0; i < p->nObjsAlloc; i++ )
        if ( Wlc_ObjCopy(p, i) > 0 && i < Vec_IntSize(&p->vNameIds) && Wlc_ObjNameId(p, i) )
            Wlc_ObjSetNameId( pNew, Wlc_ObjCopy(p, i), Wlc_ObjNameId(p, i) );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    Vec_IntErase( &p->vNameIds );
    // transfer table
    pNew->pMemTable = p->pMemTable;  p->pMemTable = NULL;
    pNew->vTables = p->vTables;      p->vTables = NULL;
}